

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QXmlStreamNamespaceDeclaration>::reallocateAndGrow
          (QArrayDataPointer<QXmlStreamNamespaceDeclaration> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QXmlStreamNamespaceDeclaration> *old)

{
  long lVar1;
  bool bVar2;
  QXmlStreamNamespaceDeclaration *pQVar3;
  QGenericArrayOps<QXmlStreamNamespaceDeclaration> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QXmlStreamNamespaceDeclaration *in_stack_ffffffffffffff70;
  QXmlStreamNamespaceDeclaration *in_stack_ffffffffffffff78;
  QGenericArrayOps<QXmlStreamNamespaceDeclaration> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
                           in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)&stack0xffffffffffffffe0)
       , pQVar3 == (QXmlStreamNamespaceDeclaration *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00662fb2;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
                          in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QXmlStreamNamespaceDeclaration> *)
                  operator->((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x662eb7);
        begin((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x662ec6);
        QtPrivate::QGenericArrayOps<QXmlStreamNamespaceDeclaration>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QXmlStreamNamespaceDeclaration *)
             operator->((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
                        &stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x662f05);
        begin((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x662f14);
        QtPrivate::QGenericArrayOps<QXmlStreamNamespaceDeclaration>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)
                       in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QXmlStreamNamespaceDeclaration>::reallocate
              ((QMovableArrayOps<QXmlStreamNamespaceDeclaration> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00662fb2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }